

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O3

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::flush_to_console
          (writer_base<cppwinrt::writer> *this,bool to_stdout)

{
  pointer pcVar1;
  undefined7 in_register_00000031;
  undefined8 *puVar2;
  
  if ((int)CONCAT71(in_register_00000031,to_stdout) == 0) {
    puVar2 = (undefined8 *)&stderr;
  }
  else {
    puVar2 = (undefined8 *)&stdout;
  }
  fprintf((FILE *)*puVar2,"%.*s",
          (ulong)(uint)(*(int *)&(this->m_first).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                       (int)(this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            super__Vector_impl_data._M_start));
  fprintf((FILE *)*puVar2,"%.*s",
          (ulong)(uint)(*(int *)&(this->m_second).super__Vector_base<char,_std::allocator<char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                       (int)(this->m_second).super__Vector_base<char,_std::allocator<char>_>._M_impl
                            .super__Vector_impl_data._M_start));
  pcVar1 = (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->m_first).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar1;
  }
  pcVar1 = (this->m_second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->m_second).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish != pcVar1) {
    (this->m_second).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data
    ._M_finish = pcVar1;
  }
  return;
}

Assistant:

void flush_to_console(bool to_stdout = true) noexcept
        {
            fprintf(to_stdout ? stdout : stderr, "%.*s", static_cast<int>(m_first.size()), m_first.data());
            fprintf(to_stdout ? stdout : stderr, "%.*s", static_cast<int>(m_second.size()), m_second.data());
            m_first.clear();
            m_second.clear();
        }